

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDGVerifier.cpp
# Opt level: O0

int __thiscall
dg::LLVMDGVerifier::verify
          (LLVMDGVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*> *it;
  iterator __end1;
  iterator __begin1;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *__range1;
  LLVMDependenceGraph *in_stack_00000030;
  Function *in_stack_00000038;
  LLVMDGVerifier *in_stack_00000040;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18;
  LLVMDGVerifier *in_stack_fffffffffffffff0;
  
  checkMainProc(in_stack_fffffffffffffff0);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::operator*
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_> *)
               0x19f2e5);
    llvm::cast<llvm::Function,llvm::Value>((Value *)0x19f2f7);
    checkGraph(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_> *)this)
    ;
  }
  fflush(_stderr);
  return (int)CONCAT71((int7)((ulong)this >> 8),this->faults == 0);
}

Assistant:

bool LLVMDGVerifier::verify() {
    checkMainProc();

    extern std::map<llvm::Value *, LLVMDependenceGraph *> constructedFunctions;
    for (auto &it : constructedFunctions)
        checkGraph(llvm::cast<llvm::Function>(it.first), it.second);

    fflush(stderr);
    return faults == 0;
}